

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlContext.cpp
# Opt level: O2

void __thiscall sf::priv::GlContext::initialize(GlContext *this,ContextSettings *requestedSettings)

{
  uint *major;
  Uint32 *pUVar1;
  uint uVar2;
  ContextSettings *pCVar3;
  bool bVar4;
  char cVar5;
  GlFunctionPointer p_Var6;
  GlFunctionPointer p_Var7;
  GlFunctionPointer p_Var8;
  GlFunctionPointer p_Var9;
  GlFunctionPointer p_Var10;
  char *pcVar11;
  ostream *poVar12;
  undefined4 in_ECX;
  int iVar13;
  uint i;
  uint uVar14;
  undefined1 auVar15 [16];
  int numExtensions;
  int minorVersion;
  int majorVersion;
  uint *local_48;
  ContextSettings *local_40;
  int flags;
  
  local_40 = requestedSettings;
  setActive(this,true);
  majorVersion = 0;
  minorVersion = 0;
  p_Var6 = getFunction("glGetIntegerv");
  p_Var7 = getFunction("glGetError");
  p_Var8 = getFunction("glGetString");
  p_Var9 = getFunction("glEnable");
  p_Var10 = getFunction("glIsEnabled");
  auVar15._0_4_ = -(uint)((int)((ulong)p_Var6 >> 0x20) == 0 && (int)p_Var6 == 0);
  auVar15._4_4_ = -(uint)((int)p_Var7 == 0 && (int)((ulong)p_Var7 >> 0x20) == 0);
  auVar15._8_4_ = -(uint)((int)((ulong)p_Var8 >> 0x20) == 0 && (int)p_Var8 == 0);
  auVar15._12_4_ = -(uint)((int)p_Var9 == 0 && (int)((ulong)p_Var9 >> 0x20) == 0);
  iVar13 = movmskps(in_ECX,auVar15);
  if (iVar13 != 0 || p_Var10 == (GlFunctionPointer)0x0) {
    poVar12 = err();
    poVar12 = std::operator<<(poVar12,
                              "Could not load necessary function to initialize OpenGL context");
    std::endl<char,std::char_traits<char>>(poVar12);
    return;
  }
  (*p_Var6)(0x821b,&majorVersion);
  (*p_Var6)(0x821c,&minorVersion);
  iVar13 = (*p_Var7)();
  if (iVar13 == 0x500) {
    (this->m_settings).majorVersion = 1;
    (this->m_settings).minorVersion = 1;
    pcVar11 = (char *)(*p_Var8)(0x1f02);
    if (pcVar11 == (char *)0x0) {
      poVar12 = err();
      pcVar11 = "Unable to retrieve OpenGL version string, defaulting to 1.1";
    }
    else {
      major = &(this->m_settings).majorVersion;
      local_48 = &(this->m_settings).minorVersion;
      bVar4 = anon_unknown.dwarf_48a186::GlContextImpl::parseVersionString
                        (pcVar11,"OpenGL ES-CL ",major,local_48);
      if ((((bVar4) ||
           (bVar4 = anon_unknown.dwarf_48a186::GlContextImpl::parseVersionString
                              (pcVar11,"OpenGL ES-CM ",major,local_48), bVar4)) ||
          (bVar4 = anon_unknown.dwarf_48a186::GlContextImpl::parseVersionString
                             (pcVar11,"OpenGL ES ",major,local_48), bVar4)) ||
         (bVar4 = anon_unknown.dwarf_48a186::GlContextImpl::parseVersionString
                            (pcVar11,"",major,local_48), bVar4)) goto LAB_001bd7f3;
      poVar12 = err();
      poVar12 = std::operator<<(poVar12,"Unable to parse OpenGL version string: \"");
      poVar12 = std::operator<<(poVar12,pcVar11);
      pcVar11 = "\", defaulting to 1.1";
    }
    poVar12 = std::operator<<(poVar12,pcVar11);
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  else {
    (this->m_settings).majorVersion = majorVersion;
    (this->m_settings).minorVersion = minorVersion;
  }
LAB_001bd7f3:
  (this->m_settings).attributeFlags = 0;
  if (2 < (this->m_settings).majorVersion) {
    flags = 0;
    (*p_Var6)(0x821e,&flags);
    if ((flags & 2U) != 0) {
      pUVar1 = &(this->m_settings).attributeFlags;
      *(byte *)pUVar1 = (byte)*pUVar1 | 4;
    }
    uVar14 = (this->m_settings).majorVersion;
    uVar2 = (this->m_settings).minorVersion;
    if (uVar2 == 1 && uVar14 == 3) {
      pUVar1 = &(this->m_settings).attributeFlags;
      *(byte *)pUVar1 = (byte)*pUVar1 | 1;
      p_Var7 = getFunction("glGetStringi");
      if (p_Var7 != (GlFunctionPointer)0x0) {
        numExtensions = 0;
        (*p_Var6)(0x821d);
        uVar14 = 0;
        do {
          if ((uint)numExtensions <= uVar14) goto LAB_001bd8bc;
          pcVar11 = (char *)(*p_Var7)(0x1f03,(ulong)uVar14);
          pcVar11 = strstr(pcVar11,"GL_ARB_compatibility");
          uVar14 = uVar14 + 1;
        } while (pcVar11 == (char *)0x0);
        pUVar1 = &(this->m_settings).attributeFlags;
        *(byte *)pUVar1 = (byte)*pUVar1 & 0xfe;
      }
    }
    else if (1 < uVar2 || 3 < uVar14) {
      numExtensions = 0;
      (*p_Var6)(0x9126,&numExtensions);
      if ((numExtensions & 1U) != 0) {
        pUVar1 = &(this->m_settings).attributeFlags;
        *(byte *)pUVar1 = (byte)*pUVar1 | 1;
      }
    }
  }
LAB_001bd8bc:
  pCVar3 = local_40;
  if ((local_40->antialiasingLevel == 0) || ((this->m_settings).antialiasingLevel == 0)) {
    (this->m_settings).antialiasingLevel = 0;
  }
  else {
    (*p_Var9)(0x809d);
  }
  if ((pCVar3->sRgbCapable == true) && ((this->m_settings).sRgbCapable == true)) {
    (*p_Var9)(0x8db9);
    cVar5 = (*p_Var10)(0x8db9);
    if (cVar5 != '\0') {
      return;
    }
    poVar12 = err();
    poVar12 = std::operator<<(poVar12,"Warning: Failed to enable GL_FRAMEBUFFER_SRGB");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  (this->m_settings).sRgbCapable = false;
  return;
}

Assistant:

void GlContext::initialize(const ContextSettings& requestedSettings)
{
    // Activate the context
    setActive(true);

    // Retrieve the context version number
    int majorVersion = 0;
    int minorVersion = 0;

    // Try the new way first
    glGetIntegervFuncType glGetIntegervFunc = reinterpret_cast<glGetIntegervFuncType>(getFunction("glGetIntegerv"));
    glGetErrorFuncType glGetErrorFunc = reinterpret_cast<glGetErrorFuncType>(getFunction("glGetError"));
    glGetStringFuncType glGetStringFunc = reinterpret_cast<glGetStringFuncType>(getFunction("glGetString"));
    glEnableFuncType glEnableFunc = reinterpret_cast<glEnableFuncType>(getFunction("glEnable"));
    glIsEnabledFuncType glIsEnabledFunc = reinterpret_cast<glIsEnabledFuncType>(getFunction("glIsEnabled"));

    if (!glGetIntegervFunc || !glGetErrorFunc || !glGetStringFunc || !glEnableFunc || !glIsEnabledFunc)
    {
        err() << "Could not load necessary function to initialize OpenGL context" << std::endl;
        return;
    }

    glGetIntegervFunc(GL_MAJOR_VERSION, &majorVersion);
    glGetIntegervFunc(GL_MINOR_VERSION, &minorVersion);

    if (glGetErrorFunc() != GL_INVALID_ENUM)
    {
        m_settings.majorVersion = static_cast<unsigned int>(majorVersion);
        m_settings.minorVersion = static_cast<unsigned int>(minorVersion);
    }
    else
    {
        // Try the old way

        // If we can't get the version number, assume 1.1
        m_settings.majorVersion = 1;
        m_settings.minorVersion = 1;

        const char* version = reinterpret_cast<const char*>(glGetStringFunc(GL_VERSION));
        if (version)
        {
            // OpenGL ES Common Lite profile: The beginning of the returned string is "OpenGL ES-CL major.minor"
            // OpenGL ES Common profile:      The beginning of the returned string is "OpenGL ES-CM major.minor"
            // OpenGL ES Full profile:        The beginning of the returned string is "OpenGL ES major.minor"
            // Desktop OpenGL:                The beginning of the returned string is "major.minor"

            using GlContextImpl::parseVersionString;

            if (!parseVersionString(version, "OpenGL ES-CL ", m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "OpenGL ES-CM ", m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "OpenGL ES ",    m_settings.majorVersion, m_settings.minorVersion) &&
                !parseVersionString(version, "",              m_settings.majorVersion, m_settings.minorVersion))
            {
                err() << "Unable to parse OpenGL version string: \"" << version << "\", defaulting to 1.1" << std::endl;
            }
        }
        else
        {
            err() << "Unable to retrieve OpenGL version string, defaulting to 1.1" << std::endl;
        }
    }

    // 3.0 contexts only deprecate features, but do not remove them yet
    // 3.1 contexts remove features if ARB_compatibility is not present
    // 3.2+ contexts remove features only if a core profile is requested

    // If the context was created with wglCreateContext, it is guaranteed to be compatibility.
    // If a 3.0 context was created with wglCreateContextAttribsARB, it is guaranteed to be compatibility.
    // If a 3.1 context was created with wglCreateContextAttribsARB, the compatibility flag
    // is set only if ARB_compatibility is present
    // If a 3.2+ context was created with wglCreateContextAttribsARB, the compatibility flag
    // would have been set correctly already depending on whether ARB_create_context_profile is supported.

    // If the user requests a 3.0 context, it will be a compatibility context regardless of the requested profile.
    // If the user requests a 3.1 context and its creation was successful, the specification
    // states that it will not be a compatibility profile context regardless of the requested
    // profile unless ARB_compatibility is present.

    m_settings.attributeFlags = ContextSettings::Default;

    if (m_settings.majorVersion >= 3)
    {
        // Retrieve the context flags
        int flags = 0;
        glGetIntegervFunc(GL_CONTEXT_FLAGS, &flags);

        if (flags & GL_CONTEXT_FLAG_DEBUG_BIT)
            m_settings.attributeFlags |= ContextSettings::Debug;

        if ((m_settings.majorVersion == 3) && (m_settings.minorVersion == 1))
        {
            m_settings.attributeFlags |= ContextSettings::Core;

            glGetStringiFuncType glGetStringiFunc = reinterpret_cast<glGetStringiFuncType>(getFunction("glGetStringi"));

            if (glGetStringiFunc)
            {
                int numExtensions = 0;
                glGetIntegervFunc(GL_NUM_EXTENSIONS, &numExtensions);

                for (unsigned int i = 0; i < static_cast<unsigned int>(numExtensions); ++i)
                {
                    const char* extensionString = reinterpret_cast<const char*>(glGetStringiFunc(GL_EXTENSIONS, i));

                    if (std::strstr(extensionString, "GL_ARB_compatibility"))
                    {
                        m_settings.attributeFlags &= ~static_cast<Uint32>(ContextSettings::Core);
                        break;
                    }
                }
            }
        }
        else if ((m_settings.majorVersion > 3) || (m_settings.minorVersion >= 2))
        {
            // Retrieve the context profile
            int profile = 0;
            glGetIntegervFunc(GL_CONTEXT_PROFILE_MASK, &profile);

            if (profile & GL_CONTEXT_CORE_PROFILE_BIT)
                m_settings.attributeFlags |= ContextSettings::Core;
        }
    }

    // Enable anti-aliasing if requested by the user and supported
    if ((requestedSettings.antialiasingLevel > 0) && (m_settings.antialiasingLevel > 0))
    {
        glEnableFunc(GL_MULTISAMPLE);
    }
    else
    {
        m_settings.antialiasingLevel = 0;
    }

    // Enable sRGB if requested by the user and supported
    if (requestedSettings.sRgbCapable && m_settings.sRgbCapable)
    {
        glEnableFunc(GL_FRAMEBUFFER_SRGB);

        // Check to see if the enable was successful
        if (glIsEnabledFunc(GL_FRAMEBUFFER_SRGB) == GL_FALSE)
        {
            err() << "Warning: Failed to enable GL_FRAMEBUFFER_SRGB" << std::endl;
            m_settings.sRgbCapable = false;
        }
    }
    else
    {
        m_settings.sRgbCapable = false;
    }
}